

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O0

void __thiscall aalcalc::outputrows(aalcalc *this,char *buffer,int strLen,FILE *fout)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint local_38;
  int counter;
  int num;
  char *bufPtr;
  FILE *fout_local;
  int strLen_local;
  char *buffer_local;
  aalcalc *this_local;
  
  local_38 = 0;
  _counter = buffer;
  fout_local._4_4_ = strLen;
  while( true ) {
    iVar1 = fprintf((FILE *)fout,"%s",_counter);
    __stream = _stderr;
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fprintf(__stream,"FATAL: Error writing %s: %s\n",buffer,pcVar3);
      exit(1);
    }
    if (fout_local._4_4_ <= iVar1) break;
    _counter = _counter + iVar1;
    fout_local._4_4_ = fout_local._4_4_ - iVar1;
    local_38 = local_38 + 1;
    fprintf(_stderr,"INFO: Attempt %d to write %s\n",(ulong)local_38,buffer);
    if (9 < (int)local_38) {
      fprintf(_stderr,"FATAL: Maximum attempts to write %s exceeded\n",buffer);
      exit(1);
    }
  }
  return;
}

Assistant:

inline void aalcalc::outputrows(const char * buffer, int strLen, FILE * fout) {

	const char * bufPtr = buffer;
	int num;
	int counter = 0;
	do {

		num = fprintf(fout, "%s", bufPtr);
		if (num < 0) {   // Write error
			fprintf(stderr, "FATAL: Error writing %s: %s\n",
				buffer, strerror(errno));
			exit(EXIT_FAILURE);
		} else if (num < strLen) {   // Incomplete write
			bufPtr += num;
			strLen -= num;
		} else return;   // Success

		fprintf(stderr, "INFO: Attempt %d to write %s\n", ++counter,
			buffer);

	} while (counter < 10);

	fprintf(stderr, "FATAL: Maximum attempts to write %s exceeded\n",
		buffer);
	exit(EXIT_FAILURE);

}